

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O3

void __thiscall
cfdcapi_coin_CfCoinSelection_Asset1_Test::TestBody(cfdcapi_coin_CfCoinSelection_Asset1_Test *this)

{
  uint32_t vout;
  int64_t amount_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 txid_00;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  pointer pUVar7;
  pointer pUVar8;
  bool bVar9;
  value_type_conflict *__val;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char *in_R9;
  long lVar13;
  int ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  int64_t amount;
  pointer puStack_110;
  pointer local_108;
  ByteData txid;
  void *handle;
  void *coin_select_handle;
  int64_t utxo_fee_amount;
  undefined1 local_c0 [16];
  ByteData256 local_b0;
  long local_98;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  int32_t utxo_index;
  undefined4 uStack_5c;
  ByteData local_48;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x312,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&utxo_fee_amount);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x313,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&amount,(Message *)&utxo_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&amount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_128) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    if (((utxo_fee_amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
       (utxo_fee_amount != 0)) {
      (**(code **)(*(long *)utxo_fee_amount + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  coin_select_handle = (void *)0x0;
  CfdGetElementsUtxoListByC(&utxos,true);
  pUVar8 = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pUVar7 = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = handle;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_ca);
  ret = CfdInitializeCoinSelection
                  (pvVar4,(int)((ulong)((long)pUVar8 - (long)pUVar7) >> 3) * 0x684bda13,3,
                   (char *)gtest_ar._0_8_,2000,-1.0,-1.0,-1.0,-1,&coin_select_handle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_128) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x328,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)&gtest_ar,"nullptr","coin_select_handle",(void **)&gtest_ar_,
             &coin_select_handle);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x329,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    if (0 < (int)((ulong)((long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13) {
      local_98 = 0x89;
      lVar13 = 0;
      do {
        pUVar7 = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_128._M_allocated_capacity = 0;
        gtest_ar._0_8_ = operator_new(0x20);
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (gtest_ar._0_8_ + 0x20);
        *(undefined8 *)(gtest_ar._0_8_ + 0x10) = 0;
        *(undefined8 *)(gtest_ar._0_8_ + 0x18) = 0;
        *(undefined8 *)gtest_ar._0_8_ = 0;
        *(undefined8 *)(gtest_ar._0_8_ + 8) = 0;
        uVar1 = *(undefined8 *)(pUVar7->block_hash + local_98 + -0x69);
        uVar2 = *(undefined8 *)(pUVar7->block_hash + local_98 + -0x69 + 8);
        uVar3 = *(undefined8 *)(pUVar7->block_hash + local_98 + -0x59 + 8);
        *(undefined8 *)(gtest_ar._0_8_ + 0x10) =
             *(undefined8 *)(pUVar7->block_hash + local_98 + -0x59);
        *(undefined8 *)(gtest_ar._0_8_ + 0x18) = uVar3;
        *(undefined8 *)gtest_ar._0_8_ = uVar1;
        *(undefined8 *)(gtest_ar._0_8_ + 8) = uVar2;
        local_128._M_allocated_capacity = (size_type)gtest_ar.message_.ptr_;
        cfd::core::ByteData::ByteData
                  (&txid,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
        if (gtest_ar._0_8_ != 0) {
          operator_delete((void *)gtest_ar._0_8_);
        }
        pvVar5 = coin_select_handle;
        pvVar4 = handle;
        cfd::core::ByteData::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo_index,&txid);
        cfd::core::ByteData256::ByteData256
                  (&local_b0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo_index);
        cfd::core::Txid::Txid((Txid *)&gtest_ar_,&local_b0);
        cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)&gtest_ar_);
        lVar6 = local_98;
        txid_00 = gtest_ar._0_8_;
        vout = *(uint32_t *)(pUVar7->block_hash + local_98 + -0x49);
        amount_00 = *(int64_t *)(pUVar7->block_hash + local_98 + -0x11);
        amount = 0;
        puStack_110 = (pointer)0x0;
        local_108 = (pointer)0x0;
        amount = (int64_t)operator_new(0x21);
        puStack_110 = (pointer)(amount + 0x21);
        *(undefined8 *)(amount + 0x10) = 0;
        *(undefined8 *)(amount + 0x18) = 0;
        *(undefined8 *)amount = 0;
        *(undefined8 *)(amount + 8) = 0;
        *(undefined1 *)(amount + 0x20) = 0;
        *(uint8_t *)(amount + 0x20) = pUVar7->block_hash[lVar6 + 0x18];
        uVar1 = *(undefined8 *)(pUVar7->block_hash + lVar6 + -8);
        uVar2 = *(undefined8 *)(pUVar7->block_hash + lVar6 + -8 + 8);
        uVar3 = *(undefined8 *)(pUVar7->block_hash + lVar6 + 8 + 8);
        *(undefined8 *)(amount + 0x10) = *(undefined8 *)(pUVar7->block_hash + lVar6 + 8);
        *(undefined8 *)(amount + 0x18) = uVar3;
        *(undefined8 *)amount = uVar1;
        *(undefined8 *)(amount + 8) = uVar2;
        local_108 = puStack_110;
        cfd::core::ByteData::ByteData
                  (&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&amount);
        if (amount != 0) {
          operator_delete((void *)amount);
        }
        cfd::core::ByteData::GetHex_abi_cxx11_((string *)&utxo_fee_amount,&local_48);
        ret = CfdAddCoinSelectionUtxo
                        (pvVar4,pvVar5,(int32_t)lVar13,(char *)txid_00,vout,amount_00,
                         (char *)utxo_fee_amount,
                         "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
                        );
        if ((undefined1 *)utxo_fee_amount != local_c0) {
          operator_delete((void *)utxo_fee_amount);
        }
        if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)gtest_ar._0_8_ != &local_128) {
          operator_delete((void *)gtest_ar._0_8_);
        }
        gtest_ar_._0_8_ = &PTR__Txid_00723450;
        if (gtest_ar_.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(gtest_ar_.message_.ptr_);
        }
        if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((void *)CONCAT44(uStack_5c,utxo_index) != (void *)0x0) {
          operator_delete((void *)CONCAT44(uStack_5c,utxo_index));
        }
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar12 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                     ,0x335,pcVar12);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
          if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
             (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if ((void *)CONCAT44(txid.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             txid.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(txid.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           txid.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_));
        }
        lVar13 = lVar13 + 1;
        local_98 = local_98 + 0xd8;
      } while (lVar13 < (int)((ulong)((long)utxos.
                                            super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)utxos.
                                           super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x684bda13);
    }
    pvVar5 = coin_select_handle;
    pvVar4 = handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_ca);
    ret = CfdAddCoinSelectionAmount(pvVar4,pvVar5,0,0x6e6f7c0,(char *)gtest_ar._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_128) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x33a,pcVar12);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar5 = coin_select_handle;
    pvVar4 = handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_cb);
    ret = CfdAddCoinSelectionAmount(pvVar4,pvVar5,1,0x14b18c08,(char *)gtest_ar._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_128) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x33d,pcVar12);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar5 = coin_select_handle;
    pvVar4 = handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_cc);
    ret = CfdAddCoinSelectionAmount(pvVar4,pvVar5,2,0x23e8e54,(char *)gtest_ar._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_128) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x340,pcVar12);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle,coin_select_handle,&utxo_fee_amount);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x344,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_._0_4_ = 0x23f0;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar,"9200","utxo_fee_amount",(int *)&gtest_ar_,&utxo_fee_amount);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x345,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    utxo_index = 0;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_128._M_allocated_capacity = 0;
    uVar11 = 0;
    if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      amount = 0;
    }
    else {
      do {
        ret = CfdGetSelectedCoinIndex(handle,coin_select_handle,(uint32_t)uVar11,&utxo_index);
        amount = amount & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&amount,&ret);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&amount);
          pcVar12 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&txid,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                     ,0x34c,pcVar12);
          testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
          if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0))
          {
            (**(code **)(*(long *)amount + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (utxo_index == -1) break;
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_128._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&gtest_ar,(iterator)gtest_ar.message_.ptr_,
                     &utxo_index);
        }
        else {
          *(int32_t *)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p = utxo_index;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 4);
        }
        uVar11 = (ulong)((uint32_t)uVar11 + 1);
        uVar10 = ((long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
      amount = (long)gtest_ar.message_.ptr_ - gtest_ar._0_8_ >> 2;
    }
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_,"5","indexes.size()",(int *)&txid,(unsigned_long *)&amount);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&txid,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x352,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
      if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0)) {
        (**(code **)(*(long *)amount + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((long)gtest_ar.message_.ptr_ - gtest_ar._0_8_ == 0x14) {
      amount = CONCAT44(amount._4_4_,8);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"8","indexes[0]",(int *)&amount,(int *)gtest_ar._0_8_);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x355,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,7);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"7","indexes[1]",(int *)&amount,(int *)(gtest_ar._0_8_ + 4))
      ;
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x356,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,10);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"10","indexes[2]",(int *)&amount,(int *)(gtest_ar._0_8_ + 8)
                );
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x357,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"1","indexes[3]",(int *)&amount,
                 (int *)(gtest_ar._0_8_ + 0xc));
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x358,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"3","indexes[4]",(int *)&amount,
                 (int *)(gtest_ar._0_8_ + 0x10));
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x359,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (((amount != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle,coin_select_handle,0,&amount);
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&txid,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36a,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (((CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((long *)CONCAT44(txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x6fc23ac;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_,"117187500","amount",(int *)&txid,&amount);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36b,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (((CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((long *)CONCAT44(txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdGetSelectedCoinAssetAmount(handle,coin_select_handle,1,&amount);
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&txid,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36d,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (((CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((long *)CONCAT44(txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x14b18c12;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_,"347180050","amount",(int *)&txid,&amount);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36e,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (((CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((long *)CONCAT44(txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdGetSelectedCoinAssetAmount(handle,coin_select_handle,2,&amount);
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&txid,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x370,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (((CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((long *)CONCAT44(txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x23e8eb8;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_,"37654200","amount",(int *)&txid,&amount);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&txid);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x371,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&txid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (((CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((long *)CONCAT44(txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           txid.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       txid.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (gtest_ar._0_8_ != 0) {
      operator_delete((void *)gtest_ar._0_8_);
    }
  }
  ret = CfdFreeCoinSelectionHandle(handle,coin_select_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x374,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x377,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(cfdcapi_coin, CfCoinSelection_Asset1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> ByteData {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    return ByteData(bytes);
  };

  void* coin_select_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(true);
  int64_t tx_fee_amount = 2000;
  double effective_fee_rate = -1;
  double long_term_fee_rate = -1;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  ret = CfdInitializeCoinSelection(
    handle, static_cast<uint32_t>(utxos.size()), 3,
    exp_dummy_asset_ca.GetHex().c_str(), tx_fee_amount,
    effective_fee_rate, long_term_fee_rate, dust_fee_rate,
    knapsack_min_change, &coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, coin_select_handle);

  if (ret == kCfdSuccess) {
    for (int32_t index = 0; index < static_cast<int32_t>(utxos.size()); ++index) {
      const Utxo& utxo = utxos[index];
      ByteData txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddCoinSelectionUtxo(
          handle, coin_select_handle, index,
          Txid(ByteData256(txid.GetBytes())).GetHex().c_str(), utxo.vout,
          utxo.amount,
          convert_to_byte(utxo.asset, sizeof(utxo.asset)).GetHex().c_str(),
          kDescriptor);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 0, 115800000,
         exp_dummy_asset_ca.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 1, 347180040,
        exp_dummy_asset_cb.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 2, 37654100,
        exp_dummy_asset_cc.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle, coin_select_handle, &utxo_fee_amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(9200, utxo_fee_amount);

    int32_t utxo_index = 0;
    std::vector<int32_t> indexes;
    for (uint32_t index = 0; index < utxos.size(); ++index) {
      ret = CfdGetSelectedCoinIndex(
          handle, coin_select_handle, index, &utxo_index);
      EXPECT_EQ(kCfdSuccess, ret);
      if (utxo_index == -1) {
        break;
      }
      indexes.push_back(utxo_index);
    }
    EXPECT_EQ(5, indexes.size());

    if (indexes.size() == 5) {
      EXPECT_EQ(8, indexes[0]);
      EXPECT_EQ(7, indexes[1]);
      EXPECT_EQ(10, indexes[2]);
      EXPECT_EQ(1, indexes[3]);
      EXPECT_EQ(3, indexes[4]);
      /*
      req:
            A,  115800000
            B,  347180050
            C,   37654200
      res:
        8:  B,  346430050
        7:  B,     750000
        10: C,   37654200
        1:  A,   78125000
        3:  A,   39062500
      */
    }

    int64_t amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 0, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(117187500, amount);
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 1, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(347180050, amount);
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 2, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(37654200, amount);
  }
  ret = CfdFreeCoinSelectionHandle(handle, coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}